

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_float.h
# Opt level: O3

double duckdb_fast_float::detail::round(double __x)

{
  uint uVar1;
  ulong uVar2;
  int *in_RDI;
  
  if (*in_RDI != 0) {
    uVar1 = in_RDI[1];
    if (-1 < (int)uVar1) {
      if ((uVar1 < 0x13) && ((ulong)uVar1 != 0)) {
        uVar2 = 0;
        do {
          uVar2 = uVar2 + 1;
        } while (uVar1 != uVar2);
      }
      return __x;
    }
  }
  return __x;
}

Assistant:

inline uint64_t round(decimal &h) {
  if ((h.num_digits == 0) || (h.decimal_point < 0)) {
    return 0;
  } else if (h.decimal_point > 18) {
    return UINT64_MAX;
  }
  // at this point, we know that h.decimal_point >= 0
  uint32_t dp = uint32_t(h.decimal_point);
  uint64_t n = 0;
  for (uint32_t i = 0; i < dp; i++) {
    n = (10 * n) + ((i < h.num_digits) ? h.digits[i] : 0);
  }
  bool round_up = false;
  if (dp < h.num_digits) {
    round_up = h.digits[dp] >= 5; // normally, we round up  
    // but we may need to round to even!
    if ((h.digits[dp] == 5) && (dp + 1 == h.num_digits)) {
      round_up = h.truncated || ((dp > 0) && (1 & h.digits[dp - 1]));
    }
  }
  if (round_up) {
    n++;
  }
  return n;
}